

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Json.cpp
# Opt level: O2

JsonArrayView __thiscall Corrade::Utility::JsonToken::asArray(JsonToken *this)

{
  ostream *output;
  Debug *pDVar1;
  char *value;
  Error local_50;
  JsonArrayView local_28;
  
  if (((uint)(this->_sizeFlagsParsedTypeType >> 0x3d) == 2) &&
     ((this->_sizeFlagsParsedTypeType & 0x1c00000000000000) != 0)) {
    JsonView<Corrade::Utility::JsonArrayItem>::JsonView
              (&local_28,this + 1,this + (this->field_2)._childCount + 1);
    return local_28;
  }
  output = Error::defaultOutput();
  Error::Error(&local_50,output,(Flags)0x0);
  pDVar1 = Debug::operator<<(&local_50.super_Debug,"Utility::JsonToken::asArray(): token is");
  value = "a parsed";
  if ((this->_sizeFlagsParsedTypeType & 0x1c00000000000000) == 0) {
    value = "an unparsed";
  }
  pDVar1 = Debug::operator<<(pDVar1,value);
  Utility::operator<<(pDVar1,this->_sizeFlagsParsedTypeType & (String|Object));
  Error::~Error(&local_50);
  abort();
}

Assistant:

JsonArrayView JsonToken::asArray() const {
    CORRADE_ASSERT(type() == Type::Array && isParsed(),
        "Utility::JsonToken::asArray(): token is" << (isParsed() ? "a parsed" : "an unparsed") << type(),
        (JsonArrayView{this + 1, this + 1}));

    return JsonArrayView{this + 1, this + 1 +
        #ifndef CORRADE_TARGET_32BIT
        _childCount
        #else
        (_childCountFlagsTypeNan & ChildCountMask)
        #endif
        };
}